

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnExport
          (BinaryReaderInterp *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pFVar2;
  ModuleDesc *pMVar3;
  Result RVar4;
  long lVar5;
  _func_int **pp_Var6;
  pointer pMVar7;
  pointer pFVar8;
  ExportDesc local_d8;
  string_view local_a8;
  string local_98;
  Var local_78;
  
  local_a8.size_ = name.size_;
  local_a8.data_ = name.data_;
  local_d8.type.name.field_2._M_allocated_capacity._0_4_ = 0;
  local_d8.type.name.field_2._4_8_ = 0;
  local_d8.type.name._M_dataplus._M_p = (pointer)0x0;
  local_d8.type.name._M_string_length._0_4_ = 0;
  local_d8.type.name._M_string_length._4_4_ = 0;
  Var::Var(&local_78,item_index,(Location *)&local_d8);
  RVar4 = SharedValidator::OnExport
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     kind,&local_78,name);
  Var::~Var(&local_78);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  switch(kind) {
  case First:
    pFVar2 = (this->func_types_).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pFVar8 = pFVar2 + item_index;
    pp_Var6 = pFVar2[item_index].super_ExternType._vptr_ExternType;
    goto LAB_0018124f;
  case Table:
    pMVar7 = (pointer)(this->table_types_).
                      super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    break;
  case Memory:
    pMVar7 = (this->memory_types_).
             super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    break;
  case Global:
    pMVar7 = (pointer)(this->global_types_).
                      super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (ulong)item_index * 3;
    goto LAB_00181248;
  case Event:
    pMVar7 = (pointer)(this->event_types_).
                      super__Vector_base<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    break;
  default:
    local_d8.type.type._M_t.
    super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
    _M_t.
    super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
    .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
            )(ExternType *)0x0;
    goto LAB_0018125d;
  }
  lVar5 = (ulong)item_index * 5;
LAB_00181248:
  pFVar8 = (pointer)(&(pMVar7->super_ExternType)._vptr_ExternType + lVar5);
  pp_Var6 = (pFVar8->super_ExternType)._vptr_ExternType;
LAB_0018124f:
  (*pp_Var6[2])(&local_d8,pFVar8);
  local_d8.type.type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )local_d8.type.name._M_dataplus._M_p;
LAB_0018125d:
  pMVar3 = this->module_;
  string_view::to_string_abi_cxx11_(&local_98,&local_a8);
  paVar1 = &local_d8.type.name.field_2;
  local_d8.type.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p + local_98._M_string_length);
  local_d8.index = item_index;
  std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::
  emplace_back<wabt::interp::ExportDesc>(&pMVar3->exports,&local_d8);
  if ((_Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>)
      local_d8.type.type._M_t.
      super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
      .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl != (ExternType *)0x0) {
    (**(code **)(*(long *)local_d8.type.type._M_t.
                          super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                          .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl + 8
                ))();
  }
  local_d8.type.type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>)
         0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.type.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8.type.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderInterp::OnExport(Index index,
                                    ExternalKind kind,
                                    Index item_index,
                                    string_view name) {
  CHECK_RESULT(validator_.OnExport(loc, kind, Var(item_index), name));

  std::unique_ptr<ExternType> type;
  switch (kind) {
    case ExternalKind::Func:   type = func_types_[item_index].Clone(); break;
    case ExternalKind::Table:  type = table_types_[item_index].Clone(); break;
    case ExternalKind::Memory: type = memory_types_[item_index].Clone(); break;
    case ExternalKind::Global: type = global_types_[item_index].Clone(); break;
    case ExternalKind::Event:  type = event_types_[item_index].Clone(); break;
  }
  module_.exports.push_back(
      ExportDesc{ExportType(name.to_string(), std::move(type)), item_index});
  return Result::Ok;
}